

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

void __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::insert_data
          (section_impl<ELFIO::Elf32_Shdr> *this,Elf_Xword pos,char *raw_data,Elf_Xword size)

{
  Elf_Xword EVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long uVar5;
  pointer pcVar6;
  char *pcVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  tuple<char_*,_std::default_delete<char[]>_> tVar8;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> _Var9;
  pointer pcVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *d_1;
  unique_ptr<char[],_std::default_delete<char[]>_> new_data;
  Elf_Xword new_data_size;
  char *d;
  Elf_Xword new_size;
  Elf_Xword size_local;
  char *raw_data_local;
  Elf_Xword pos_local;
  section_impl<ELFIO::Elf32_Shdr> *this_local;
  
  new_size = size;
  size_local = (Elf_Xword)raw_data;
  raw_data_local = (char *)pos;
  pos_local = (Elf_Xword)this;
  iVar3 = (*(this->super_section)._vptr_section[5])();
  pcVar7 = raw_data_local;
  if ((iVar3 != 8) &&
     (iVar3 = (*(this->super_section)._vptr_section[0x13])(),
     pcVar7 <= (char *)CONCAT44(extraout_var,iVar3))) {
    iVar3 = (*(this->super_section)._vptr_section[0x13])();
    EVar1 = new_size;
    d = (char *)CONCAT44(extraout_var_00,iVar3);
    uVar5 = std::numeric_limits<unsigned_long>::max();
    if (EVar1 <= uVar5 - (long)d) {
      d = d + new_size;
      if ((char *)this->data_size < d) {
        tVar8.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)this->data_size;
        new_data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             tVar8.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
        uVar5 = std::numeric_limits<unsigned_long>::max();
        EVar1 = new_size;
        if (uVar5 >> 1 <
            (ulong)tVar8.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl) {
          return;
        }
        new_data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             ((long)new_data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl << 1);
        uVar5 = std::numeric_limits<unsigned_long>::max();
        if (uVar5 - (long)new_data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                          _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                          super__Head_base<0UL,_char_*,_false>._M_head_impl < EVar1) {
          return;
        }
        tVar8.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)
             (new_size +
             (long)new_data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl);
        new_data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             tVar8.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
        _Var9._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (tuple<char_*,_std::default_delete<char[]>_>)std::numeric_limits<unsigned_long>::max();
        if ((ulong)_Var9._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl <
            (ulong)tVar8.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl) {
          return;
        }
        pcVar7 = (char *)operator_new__((ulong)new_data._M_t.
                                               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                               .super__Head_base<0UL,_char_*,_false>._M_head_impl,
                                        (nothrow_t *)&std::nothrow);
        std::unique_ptr<char[],std::default_delete<char[]>>::
        unique_ptr<char*,std::default_delete<char[]>,void,bool>
                  ((unique_ptr<char[],std::default_delete<char[]>> *)&d_1,pcVar7);
        bVar2 = std::operator!=((nullptr_t)0x0,
                                (unique_ptr<char[],_std::default_delete<char[]>_> *)&d_1);
        if (bVar2) {
          pcVar6 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
          pcVar7 = pcVar6 + (long)raw_data_local;
          pcVar10 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&d_1);
          std::copy<char*,char*>(pcVar6,pcVar7,pcVar10);
          EVar1 = size_local;
          pcVar7 = (char *)(size_local + new_size);
          pcVar10 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&d_1);
          std::copy<char_const*,char*>((char *)EVar1,pcVar7,pcVar10 + (long)raw_data_local);
          pcVar7 = pcVar6 + (long)raw_data_local;
          iVar3 = (*(this->super_section)._vptr_section[0x13])();
          pcVar10 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&d_1);
          std::copy<char*,char*>
                    (pcVar7,pcVar6 + CONCAT44(extraout_var_03,iVar3),
                     pcVar10 + (long)raw_data_local + new_size);
          std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
                    (&this->data,(unique_ptr<char[],_std::default_delete<char[]>_> *)&d_1);
          this->data_size =
               (Elf_Xword)
               new_data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
        }
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)&d_1);
        if (!bVar2) {
          return;
        }
      }
      else {
        pcVar6 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
        pcVar7 = pcVar6 + (long)raw_data_local;
        iVar3 = (*(this->super_section)._vptr_section[0x13])();
        iVar4 = (*(this->super_section)._vptr_section[0x13])();
        std::copy_backward<char*,char*>
                  (pcVar7,pcVar6 + CONCAT44(extraout_var_01,iVar3),
                   pcVar6 + new_size + CONCAT44(extraout_var_02,iVar4));
        std::copy<char_const*,char*>
                  ((char *)size_local,(char *)(size_local + new_size),pcVar6 + (long)raw_data_local)
        ;
      }
      (*(this->super_section)._vptr_section[0x14])(this,&d);
      bVar2 = address_translator::empty(this->translator);
      if (bVar2) {
        iVar3 = (*(this->super_section)._vptr_section[0x20])();
        (*(this->super_section)._vptr_section[0x21])
                  (this,CONCAT44(extraout_var_04,iVar3) + new_size);
      }
    }
  }
  return;
}

Assistant:

void
    insert_data( Elf_Xword pos, const char* raw_data, Elf_Xword size ) override
    {
        if ( get_type() != SHT_NOBITS ) {
            // Check for valid position
            if ( pos > get_size() ) {
                return; // Invalid position
            }

            // Check for integer overflow in size calculation
            Elf_Xword new_size = get_size();
            if ( size > std::numeric_limits<Elf_Xword>::max() - new_size ) {
                return; // Size would overflow
            }
            new_size += size;

            if ( new_size <= data_size ) {
                char* d = data.get();
                std::copy_backward( d + pos, d + get_size(),
                                    d + get_size() + size );
                std::copy( raw_data, raw_data + size, d + pos );
            }
            else {
                // Calculate new size with overflow check
                Elf_Xword new_data_size = data_size;
                if ( new_data_size > std::numeric_limits<Elf_Xword>::max() / 2 ) {
                    return; // Multiplication would overflow
                }
                new_data_size *= 2;
                if ( size > std::numeric_limits<Elf_Xword>::max() - new_data_size ) {
                    return; // Addition would overflow
                }
                new_data_size += size;

                // Check if the size would overflow size_t
                if (new_data_size > std::numeric_limits<size_t>::max()) {
                    return; // Size would overflow size_t
                }

                std::unique_ptr<char[]> new_data(
                    new (std::nothrow) char[(size_t)new_data_size]);

                if ( nullptr != new_data ) {
                    char* d = data.get();
                    std::copy( d, d + pos, new_data.get() );
                    std::copy( raw_data, raw_data + size,
                               new_data.get() + pos );
                    std::copy( d + pos, d + get_size(),
                               new_data.get() + pos + size );
                    data = std::move( new_data );
                    data_size = new_data_size;
                }
                else {
                    return; // Allocation failed
                }
            }
            set_size( new_size );
            if ( translator->empty() ) {
                set_stream_size( get_stream_size() + (size_t)size );
            }
        }
    }